

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Facet.hpp
# Opt level: O2

bool __thiscall
Parfait::Facet::triBoxOverlap
          (Facet *this,Point<double> *boxcenter,Point<double> *boxhalfsize,
          array<Parfait::Point<double>,_3UL> *triverts)

{
  bool bVar1;
  int i;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  pair<double,_double> pVar6;
  Point<double> local_140;
  Point<double> local_128;
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  double dStack_f0;
  Point<double> local_e0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  double dStack_a0;
  double local_98;
  double dStack_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  double dStack_30;
  Point<double> local_28;
  
  local_e0.pos._M_elems[2] = (boxcenter->pos)._M_elems[2];
  local_140.pos._M_elems[2] = triverts->_M_elems[0].pos._M_elems[2] - local_e0.pos._M_elems[2];
  local_e0.pos._M_elems[0] = (boxcenter->pos)._M_elems[0];
  dVar5 = (boxcenter->pos)._M_elems[1];
  local_140.pos._M_elems[0] = triverts->_M_elems[0].pos._M_elems[0] - local_e0.pos._M_elems[0];
  uStack_100 = 0;
  local_128.pos._M_elems[0] = triverts->_M_elems[1].pos._M_elems[0] - local_e0.pos._M_elems[0];
  local_140.pos._M_elems[1] = triverts->_M_elems[0].pos._M_elems[1] - dVar5;
  local_e0.pos._M_elems[0] = triverts->_M_elems[2].pos._M_elems[0] - local_e0.pos._M_elems[0];
  local_128.pos._M_elems[1] = triverts->_M_elems[1].pos._M_elems[1] - dVar5;
  local_128.pos._M_elems[2] = triverts->_M_elems[1].pos._M_elems[2] - local_e0.pos._M_elems[2];
  local_e0.pos._M_elems[2] = triverts->_M_elems[2].pos._M_elems[2] - local_e0.pos._M_elems[2];
  dVar5 = triverts->_M_elems[2].pos._M_elems[1] - dVar5;
  local_a8 = local_e0.pos._M_elems[0] - local_128.pos._M_elems[0];
  dStack_a0 = local_128.pos._M_elems[1] - local_140.pos._M_elems[1];
  uStack_b0 = 0;
  local_88 = local_128.pos._M_elems[2] - local_140.pos._M_elems[2];
  dStack_80 = local_e0.pos._M_elems[2] - local_128.pos._M_elems[2];
  local_98 = ABS(dStack_a0);
  dStack_90 = ABS(dStack_a0);
  dVar3 = ABS(local_88);
  local_108 = local_140.pos._M_elems[0];
  local_f8 = local_128.pos._M_elems[0];
  dStack_f0 = local_140.pos._M_elems[1];
  local_e0.pos._M_elems[1] = dVar5;
  local_b8 = local_140.pos._M_elems[2];
  local_68 = dStack_a0;
  dStack_60 = dStack_a0;
  local_58 = local_e0.pos._M_elems[0];
  dStack_50 = local_128.pos._M_elems[1];
  local_38 = local_128.pos._M_elems[2];
  dStack_30 = local_e0.pos._M_elems[2];
  bVar1 = AXISTEST_X(local_88,dStack_a0,dVar3,local_98,&local_140,&local_e0,boxhalfsize);
  if (!bVar1) {
    local_c8 = local_f8 - local_108;
    dStack_c0 = dVar5 - dStack_50;
    dVar4 = ABS(local_c8);
    bVar1 = AXISTEST_Y(local_88,local_c8,dVar3,dVar4,&local_140,&local_e0,boxhalfsize);
    if ((!bVar1) &&
       (bVar1 = AXISTEST_Z(local_68,local_c8,local_98,dVar4,&local_128,&local_e0,boxhalfsize),
       dVar3 = dStack_80, !bVar1)) {
      local_48 = ABS(dStack_c0);
      dStack_40 = ABS(dStack_c0);
      local_98 = ABS(dStack_80);
      dStack_90 = ABS(dStack_80);
      local_78 = dStack_c0;
      dStack_70 = dStack_c0;
      bVar1 = AXISTEST_X(dStack_80,dStack_c0,local_98,local_48,&local_140,&local_e0,boxhalfsize);
      if (!bVar1) {
        dVar4 = ABS(local_a8);
        bVar1 = AXISTEST_Y(dVar3,local_a8,local_98,dVar4,&local_140,&local_e0,boxhalfsize);
        if ((!bVar1) &&
           (bVar1 = AXISTEST_Z(local_78,local_a8,local_48,dVar4,&local_140,&local_128,boxhalfsize),
           !bVar1)) {
          local_f8 = dStack_f0 - dVar5;
          local_b8 = local_b8 - dStack_30;
          dVar3 = ABS(local_f8);
          dVar5 = ABS(local_b8);
          bVar1 = AXISTEST_X(local_b8,local_f8,dVar5,dVar3,&local_140,&local_128,boxhalfsize);
          if (!bVar1) {
            local_108 = local_108 - local_58;
            dVar4 = ABS(local_108);
            bVar1 = AXISTEST_Y(local_b8,local_108,dVar5,dVar4,&local_140,&local_128,boxhalfsize);
            if ((!bVar1) &&
               (bVar1 = AXISTEST_Z(local_f8,local_108,dVar3,dVar4,&local_128,&local_e0,boxhalfsize),
               !bVar1)) {
              lVar2 = 0;
              while( true ) {
                if (lVar2 == 3) {
                  local_28.pos._M_elems[2] = local_c8 * local_78 - local_68 * local_a8;
                  local_28.pos._M_elems[1] = local_a8 * local_88 - dStack_80 * local_c8;
                  local_28.pos._M_elems[0] = dStack_a0 * dStack_80 - local_88 * dStack_c0;
                  bVar1 = planeBoxOverlap(&local_28,&local_140,boxhalfsize);
                  return bVar1;
                }
                pVar6 = findMinMax(local_140.pos._M_elems[lVar2],local_128.pos._M_elems[lVar2],
                                   local_e0.pos._M_elems[lVar2]);
                dVar5 = (boxhalfsize->pos)._M_elems[lVar2];
                if (dVar5 < pVar6.first + -1e-10) break;
                lVar2 = lVar2 + 1;
                if (pVar6.second + 1e-10 < -dVar5) {
                  return false;
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

inline bool Parfait::Facet::triBoxOverlap(
    const Parfait::Point<double>& boxcenter,
    const Parfait::Point<double>& boxhalfsize,
    const std::array<Parfait::Point<double>,3>& triverts) const {

    auto v0 = triverts[0] - boxcenter;
    auto v1 = triverts[1] - boxcenter;
    auto v2 = triverts[2] - boxcenter;

    auto e0 = v1 - v0;
    auto e1 = v2 - v1;
    auto e2 = v0 - v2;

    auto fex = fabs(e0[0]);
    auto fey = fabs(e0[1]);
    auto fez = fabs(e0[2]);
    if(AXISTEST_X(e0[2], e0[1], fez, fey, v0, v2, boxhalfsize)) return false;
    if(AXISTEST_Y(e0[2], e0[0], fez, fex, v0, v2, boxhalfsize)) return false;
    if(AXISTEST_Z(e0[1], e0[0], fey, fex, v1, v2, boxhalfsize)) return false;

    fex = fabs(e1[0]);
    fey = fabs(e1[1]);
    fez = fabs(e1[2]);
    if(AXISTEST_X(e1[2], e1[1], fez, fey, v0, v2, boxhalfsize)) return false;
    if(AXISTEST_Y(e1[2], e1[0], fez, fex, v0, v2, boxhalfsize)) return false;
    if(AXISTEST_Z(e1[1], e1[0], fey, fex, v0, v1, boxhalfsize)) return false;

    fex = fabs(e2[0]);
    fey = fabs(e2[1]);
    fez = fabs(e2[2]);
    if(AXISTEST_X(e2[2], e2[1], fez, fey, v0, v1, boxhalfsize)) return false;
    if(AXISTEST_Y(e2[2], e2[0], fez, fex, v0, v1, boxhalfsize)) return false;
    if(AXISTEST_Z(e2[1], e2[0], fey, fex, v1, v2, boxhalfsize)) return false;

    for(int i = 0; i < 3; i++) {
        double min, max;
        std::tie(min, max) = findMinMax(v0[i], v1[i], v2[i]);
        if (min - TOL > boxhalfsize[i] || max + TOL < -boxhalfsize[i]) return false;
    }
    auto normal = Parfait::Point<double>::cross(e0, e1);
    return planeBoxOverlap(normal, v0, boxhalfsize);
}